

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SampleFromVoxels.h
# Opt level: O2

bool __thiscall
nanovdb::
TrilinearSampler<nanovdb::Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>>>
::update<nanovdb::Vec3<float>>
          (TrilinearSampler<nanovdb::Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,nanovdb::Coord,nanovdb::Mask,3u>,4u>,5u>>>>
           *this,Vec3<float> *xyz)

{
  bool bVar1;
  ValueType *pVVar2;
  undefined1 auVar3 [16];
  CoordType local_20;
  
  local_20.mVec = (int32_t  [3])Floor<nanovdb::Coord,nanovdb::Vec3>(xyz);
  if (((*(int *)(this + 8) == local_20.mVec[0]) && (*(int *)(this + 0xc) == local_20.mVec[1])) &&
     (local_20.mVec[2] == *(int *)(this + 0x10))) {
    bVar1 = false;
  }
  else {
    *(int *)(this + 0x10) = local_20.mVec[2];
    *(undefined8 *)(this + 8) = local_20.mVec._0_8_;
    pVVar2 = Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
             ::getValue(*(Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
                          **)this,&local_20);
    *(ValueType *)(this + 0x14) = *pVVar2;
    local_20.mVec[2] = local_20.mVec[2] + 1;
    pVVar2 = Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
             ::getValue(*(Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
                          **)this,&local_20);
    *(ValueType *)(this + 0x18) = *pVVar2;
    local_20.mVec[1] = local_20.mVec[1] + 1;
    pVVar2 = Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
             ::getValue(*(Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
                          **)this,&local_20);
    *(ValueType *)(this + 0x20) = *pVVar2;
    local_20.mVec[2] = local_20.mVec[2] + -1;
    pVVar2 = Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
             ::getValue(*(Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
                          **)this,&local_20);
    *(ValueType *)(this + 0x1c) = *pVVar2;
    auVar3._8_8_ = 0;
    auVar3._0_4_ = local_20.mVec[0];
    auVar3._4_4_ = local_20.mVec[1];
    auVar3 = vpaddd_avx(auVar3,_DAT_00596470);
    local_20.mVec._0_8_ = auVar3._0_8_;
    pVVar2 = Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
             ::getValue(*(Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
                          **)this,&local_20);
    *(ValueType *)(this + 0x24) = *pVVar2;
    local_20.mVec[2] = local_20.mVec[2] + 1;
    pVVar2 = Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
             ::getValue(*(Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
                          **)this,&local_20);
    *(ValueType *)(this + 0x28) = *pVVar2;
    local_20.mVec[1] = local_20.mVec[1] + 1;
    pVVar2 = Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
             ::getValue(*(Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
                          **)this,&local_20);
    *(ValueType *)(this + 0x30) = *pVVar2;
    local_20.mVec[2] = local_20.mVec[2] + -1;
    pVVar2 = Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
             ::getValue(*(Tree<nanovdb::RootNode<nanovdb::InternalNode<nanovdb::InternalNode<nanovdb::LeafNode<float,_nanovdb::Coord,_nanovdb::Mask,_3U>,_4U>,_5U>_>_>
                          **)this,&local_20);
    bVar1 = true;
    *(ValueType *)(this + 0x2c) = *pVVar2;
  }
  return bVar1;
}

Assistant:

bool TrilinearSampler<TreeOrAccT>::update(Vec3T& xyz)
{
    CoordT ijk = Floor<CoordT>(xyz);

    if (ijk == mPos)
        return false; // early out - reuse cached values

    mPos = ijk;

    mVal[0][0][0] = mAcc->getValue(ijk); // i, j, k

    ijk[2] += 1;
    mVal[0][0][1] = mAcc->getValue(ijk); // i, j, k + 1

    ijk[1] += 1;
    mVal[0][1][1] = mAcc->getValue(ijk); // i, j+1, k + 1

    ijk[2] -= 1;
    mVal[0][1][0] = mAcc->getValue(ijk); // i, j+1, k

    ijk[0] += 1;
    ijk[1] -= 1;
    mVal[1][0][0] = mAcc->getValue(ijk); // i+1, j, k

    ijk[2] += 1;
    mVal[1][0][1] = mAcc->getValue(ijk); // i+1, j, k + 1

    ijk[1] += 1;
    mVal[1][1][1] = mAcc->getValue(ijk); // i+1, j+1, k + 1

    ijk[2] -= 1;
    mVal[1][1][0] = mAcc->getValue(ijk); // i+1, j+1, k

    return true;
}